

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webvttparser.cc
# Opt level: O3

bool __thiscall libwebvtt::Time::operator<(Time *this,Time *rhs)

{
  bool bVar1;
  
  bVar1 = true;
  if (rhs->hours <= this->hours) {
    if (this->hours <= rhs->hours) {
      if (this->minutes < rhs->minutes) {
        return true;
      }
      if (this->minutes <= rhs->minutes) {
        if (this->seconds < rhs->seconds) {
          return true;
        }
        if (this->seconds <= rhs->seconds) {
          return this->milliseconds < rhs->milliseconds;
        }
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Time::operator<(const Time& rhs) const {
  if (hours < rhs.hours)
    return true;

  if (hours > rhs.hours)
    return false;

  if (minutes < rhs.minutes)
    return true;

  if (minutes > rhs.minutes)
    return false;

  if (seconds < rhs.seconds)
    return true;

  if (seconds > rhs.seconds)
    return false;

  return (milliseconds < rhs.milliseconds);
}